

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::_::
concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>>
          (String *__return_storage_ptr__,_ *this,ArrayPtr<const_char> *params,
          FixedArray<char,_1UL> *params_1,ArrayPtr<const_char> *params_2,
          FixedArray<char,_1UL> *params_3,ArrayPtr<const_char> *params_4,
          FixedArray<char,_1UL> *params_5,ArrayPtr<const_char> *params_6)

{
  size_t size;
  char *target;
  ArrayPtr<const_char> *first;
  FixedArray<char,_1UL> *rest;
  ArrayPtr<const_char> *rest_1;
  FixedArray<char,_1UL> *rest_2;
  ArrayPtr<const_char> *rest_3;
  FixedArray<char,_1UL> *rest_4;
  ArrayPtr<const_char> *rest_5;
  size_type extraout_RDX;
  initializer_list<unsigned_long> nums;
  size_t local_88;
  size_t local_80;
  size_t local_78;
  size_t local_70;
  size_t local_68;
  size_t local_60;
  size_t local_58;
  _ *local_50;
  undefined8 local_48;
  undefined1 local_39;
  ArrayPtr<const_char> *local_38;
  ArrayPtr<const_char> *params_local_4;
  FixedArray<char,_1UL> *params_local_3;
  ArrayPtr<const_char> *params_local_2;
  FixedArray<char,_1UL> *params_local_1;
  ArrayPtr<const_char> *params_local;
  String *result;
  
  local_39 = 0;
  local_38 = (ArrayPtr<const_char> *)params_3;
  params_local_4 = params_2;
  params_local_3 = params_1;
  params_local_2 = params;
  params_local_1 = (FixedArray<char,_1UL> *)this;
  params_local = (ArrayPtr<const_char> *)__return_storage_ptr__;
  local_88 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)this);
  local_80 = FixedArray<char,_1UL>::size((FixedArray<char,_1UL> *)params_local_2);
  local_78 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_local_3);
  local_70 = FixedArray<char,_1UL>::size((FixedArray<char,_1UL> *)params_local_4);
  local_68 = ArrayPtr<const_char>::size(local_38);
  local_60 = FixedArray<char,_1UL>::size((FixedArray<char,_1UL> *)params_4);
  local_58 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_5);
  local_50 = (_ *)&local_88;
  local_48 = 7;
  nums._M_len = extraout_RDX;
  nums._M_array = (iterator)0x7;
  size = sum(local_50,nums);
  heapString(__return_storage_ptr__,size);
  target = String::begin(__return_storage_ptr__);
  first = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_1);
  rest = fwd<kj::FixedArray<char,1ul>>((NoInfer<kj::FixedArray<char,_1UL>_> *)params_local_2);
  rest_1 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_local_3);
  rest_2 = fwd<kj::FixedArray<char,1ul>>((NoInfer<kj::FixedArray<char,_1UL>_> *)params_local_4);
  rest_3 = fwd<kj::ArrayPtr<char_const>>(local_38);
  rest_4 = fwd<kj::FixedArray<char,1ul>>((NoInfer<kj::FixedArray<char,_1UL>_> *)params_4);
  rest_5 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_5);
  fill<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>>
            (target,first,rest,rest_1,rest_2,rest_3,rest_4,rest_5);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}